

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::run_callback(App *this,bool final_mode,bool suppress_final_callback)

{
  undefined1 *puVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  iterator this_00;
  reference ppAVar6;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  byte in_DL;
  byte in_SIL;
  App *in_RDI;
  shared_ptr<CLI::App> *subc_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1_1;
  App *subc;
  iterator __end1;
  iterator __begin1;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__range1;
  App *in_stack_ffffffffffffff78;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *in_stack_ffffffffffffff90;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_68;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *local_60;
  App *local_48;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> local_38;
  undefined1 local_30 [30];
  bool bVar10;
  undefined6 in_stack_fffffffffffffff0;
  
  bVar9 = in_SIL & 1;
  bVar3 = in_DL & 1;
  (*in_RDI->_vptr_App[2])();
  if (((bVar9 & 1) == 0) &&
     (bVar4 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1684e9), bVar4)) {
    std::function<void_()>::operator()((function<void_()> *)in_RDI);
  }
  get_subcommands(in_stack_ffffffffffffff78);
  unique0x00004e80 = local_30;
  local_38._M_current =
       (App **)std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::begin
                         ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)
                          in_stack_ffffffffffffff78);
  this_00 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::end
                      ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)in_stack_ffffffffffffff78)
  ;
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                             *)in_stack_ffffffffffffff78), bVar5) {
    ppAVar6 = __gnu_cxx::
              __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
              ::operator*(&local_38);
    puVar1 = stack0xffffffffffffffe8;
    local_48 = *ppAVar6;
    if (local_48->parent_ == in_RDI) {
      bVar10 = SUB81((ulong)stack0xffffffffffffffe8 >> 0x38,0);
      bVar2 = bVar10;
      bVar4 = SUB81((ulong)puVar1 >> 0x30,0);
      bVar5 = bVar4;
      unique0x10000394 = puVar1;
      run_callback((App *)CONCAT17(bVar9,CONCAT16(bVar3,in_stack_fffffffffffffff0)),bVar2,bVar5);
    }
    __gnu_cxx::__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
    ::operator++(&local_38);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(in_stack_ffffffffffffff90);
  local_60 = &in_RDI->subcommands_;
  local_68._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                  in_stack_ffffffffffffff78);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
            ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             in_stack_ffffffffffffff78);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)in_stack_ffffffffffffff78), bVar5) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator*(&local_68);
    std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x16861d);
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x168639
                );
      sVar8 = count_all((App *)this_00._M_current);
      if (sVar8 != 0) {
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x168651);
        puVar1 = stack0xffffffffffffffe8;
        bVar10 = SUB81((ulong)stack0xffffffffffffffe8 >> 0x38,0);
        bVar2 = bVar10;
        bVar4 = SUB81((ulong)puVar1 >> 0x30,0);
        bVar5 = bVar4;
        unique0x1000039c = puVar1;
        run_callback((App *)CONCAT17(bVar9,CONCAT16(bVar3,in_stack_fffffffffffffff0)),bVar2,bVar5);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_68);
  }
  bVar5 = ::std::function::operator_cast_to_bool((function<void_()> *)0x168689);
  if ((((bVar5) && (in_RDI->parsed_ != 0)) && ((bVar3 & 1) == 0)) &&
     (((uVar7 = ::std::__cxx11::string::empty(), (uVar7 & 1) == 0 ||
       (sVar8 = count_all((App *)this_00._M_current), sVar8 != 0)) ||
      (in_RDI->parent_ == (App *)0x0)))) {
    std::function<void_()>::operator()((function<void_()> *)in_RDI);
  }
  return;
}

Assistant:

CLI11_INLINE void App::run_callback(bool final_mode, bool suppress_final_callback) {
    pre_callback();
    // in the main app if immediate_callback_ is set it runs the main callback before the used subcommands
    if(!final_mode && parse_complete_callback_) {
        parse_complete_callback_();
    }
    // run the callbacks for the received subcommands
    for(App *subc : get_subcommands()) {
        if(subc->parent_ == this) {
            subc->run_callback(true, suppress_final_callback);
        }
    }
    // now run callbacks for option_groups
    for(auto &subc : subcommands_) {
        if(subc->name_.empty() && subc->count_all() > 0) {
            subc->run_callback(true, suppress_final_callback);
        }
    }

    // finally run the main callback
    if(final_callback_ && (parsed_ > 0) && (!suppress_final_callback)) {
        if(!name_.empty() || count_all() > 0 || parent_ == nullptr) {
            final_callback_();
        }
    }
}